

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

void btSolveL1T(btScalar *L,btScalar *B,int n,int lskip1)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  btScalar *pbVar9;
  float *pfVar10;
  long lVar11;
  float *pfVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  float *pfVar16;
  int iVar17;
  float *pfVar18;
  ulong uVar19;
  long lVar20;
  btScalar *pbVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  lVar20 = (long)((lskip1 + 1) * (n + -1));
  pfVar1 = L + lVar20;
  pfVar10 = B + (long)n + -1;
  uVar19 = 0;
  if (3 < n) {
    lVar11 = (long)lskip1;
    iVar17 = 4;
    uVar19 = 0;
    pfVar16 = pfVar1;
    do {
      pfVar18 = pfVar10;
      if (uVar19 == 0) {
        fVar22 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        iVar15 = 0;
        pfVar12 = pfVar1;
      }
      else {
        fVar22 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        pfVar12 = pfVar16;
        iVar14 = iVar17;
        do {
          iVar15 = iVar14;
          fVar5 = *pfVar18;
          fVar6 = pfVar18[-3];
          fVar7 = pfVar18[-2];
          fVar8 = pfVar18[-1];
          pfVar2 = pfVar12 + (-3 - lVar11);
          pfVar3 = pfVar12 + lVar11 * -2 + -3;
          pfVar4 = pfVar12 + lVar11 * -3 + -3;
          fVar22 = fVar6 * *pfVar4 +
                   fVar7 * *pfVar3 + fVar8 * *pfVar2 + fVar5 * pfVar12[-3] + fVar22;
          fVar23 = fVar6 * pfVar4[1] +
                   fVar7 * pfVar3[1] + fVar8 * pfVar2[1] + fVar5 * pfVar12[-2] + fVar23;
          fVar24 = fVar6 * pfVar4[2] +
                   fVar7 * pfVar3[2] + fVar8 * pfVar2[2] + fVar5 * pfVar12[-1] + fVar24;
          fVar25 = fVar6 * pfVar4[3] +
                   fVar7 * pfVar3[3] + fVar8 * pfVar2[3] + fVar5 * *pfVar12 + fVar25;
          pfVar18 = pfVar18 + -4;
          iVar14 = iVar15 + -4;
          pfVar12 = pfVar12 + lVar11 * -4;
        } while (7 < iVar14);
        iVar15 = iVar15 + -8;
      }
      if (0 < iVar15) {
        iVar15 = iVar15 + 1;
        do {
          fVar5 = *pfVar18;
          fVar22 = fVar22 + fVar5 * pfVar12[-3];
          fVar23 = fVar23 + fVar5 * pfVar12[-2];
          fVar24 = fVar24 + fVar5 * pfVar12[-1];
          fVar25 = fVar25 + fVar5 * *pfVar12;
          pfVar18 = pfVar18 + -1;
          iVar15 = iVar15 + -1;
          pfVar12 = pfVar12 + -lVar11;
        } while (1 < iVar15);
      }
      fVar25 = *pfVar18 - fVar25;
      *pfVar18 = fVar25;
      fVar24 = (pfVar18[-1] - fVar24) - pfVar12[-1] * fVar25;
      pfVar18[-1] = fVar24;
      fVar23 = ((pfVar18[-2] - fVar23) - pfVar12[-2] * fVar25) - pfVar12[-2 - lskip1] * fVar24;
      pfVar18[-2] = fVar23;
      pfVar18[-3] = (((pfVar18[-3] - fVar22) - fVar25 * pfVar12[-3]) - fVar24 * pfVar12[-3 - lskip1]
                    ) - fVar23 * pfVar12[lskip1 * -2 + -3];
      uVar19 = uVar19 + 4;
      iVar17 = iVar17 + 4;
      pfVar16 = pfVar16 + -4;
    } while ((long)uVar19 <= (long)(n + -4));
  }
  if ((int)uVar19 < n) {
    uVar13 = uVar19 & 0xffffffff;
    iVar17 = (int)uVar19 + 4;
    pfVar16 = L + (lVar20 - uVar13);
    lVar20 = (long)lskip1;
    do {
      if (uVar13 < 4) {
        pfVar12 = pfVar1 + -uVar13;
        fVar22 = 0.0;
        iVar15 = (int)uVar13;
        pfVar18 = pfVar10;
      }
      else {
        fVar22 = 0.0;
        pbVar9 = B + (long)n + -2;
        pfVar18 = pfVar16;
        iVar14 = iVar17;
        do {
          iVar15 = iVar14;
          pfVar12 = pfVar18;
          pbVar21 = pbVar9;
          fVar22 = pfVar12[lVar20 * -2] * (float)((ulong)*(undefined8 *)(pbVar21 + -2) >> 0x20) +
                   *pfVar12 * (float)((ulong)*(undefined8 *)pbVar21 >> 0x20) + fVar22 +
                   pfVar12[-lVar20] * (float)*(undefined8 *)pbVar21 +
                   pfVar12[lVar20 * -3] * (float)*(undefined8 *)(pbVar21 + -2);
          iVar14 = iVar15 + -4;
          pbVar9 = pbVar21 + -4;
          pfVar18 = pfVar12 + lVar20 * -4;
        } while (7 < iVar14);
        pfVar12 = pfVar12 + lVar20 * -4;
        iVar15 = iVar15 + -8;
        pfVar18 = pbVar21 + -3;
      }
      if (0 < iVar15) {
        iVar15 = iVar15 + 1;
        do {
          fVar22 = fVar22 + *pfVar12 * *pfVar18;
          pfVar18 = pfVar18 + -1;
          iVar15 = iVar15 + -1;
          pfVar12 = pfVar12 + -lVar20;
        } while (1 < iVar15);
      }
      *pfVar18 = *pfVar18 - fVar22;
      uVar13 = uVar13 + 1;
      iVar17 = iVar17 + 1;
      pfVar16 = pfVar16 + -1;
    } while (uVar13 != (uint)n);
  }
  return;
}

Assistant:

void btSolveL1T (const btScalar *L, btScalar *B, int n, int lskip1)
{  
  /* declare variables - Z matrix, p and q vectors, etc */
  btScalar Z11,m11,Z21,m21,Z31,m31,Z41,m41,p1,q1,p2,p3,p4,*ex;
  const btScalar *ell;
  int lskip2,i,j;
//  int lskip3;
  /* special handling for L and B because we're solving L1 *transpose* */
  L = L + (n-1)*(lskip1+1);
  B = B + n-1;
  lskip1 = -lskip1;
  /* compute lskip values */
  lskip2 = 2*lskip1;
  //lskip3 = 3*lskip1;
  /* compute all 4 x 1 blocks of X */
  for (i=0; i <= n-4; i+=4) {
    /* compute all 4 x 1 block of X, from rows i..i+4-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    Z21=0;
    Z31=0;
    Z41=0;
    ell = L - i;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-4; j >= 0; j -= 4) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-1];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-2];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-3];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      ex -= 4;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 4;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[-1];
      p3=ell[-2];
      p4=ell[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      m21 = p2 * q1;
      m31 = p3 * q1;
      m41 = p4 * q1;
      ell += lskip1;
      ex -= 1;
      Z11 += m11;
      Z21 += m21;
      Z31 += m31;
      Z41 += m41;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
    p1 = ell[-1];
    Z21 = ex[-1] - Z21 - p1*Z11;
    ex[-1] = Z21;
    p1 = ell[-2];
    p2 = ell[-2+lskip1];
    Z31 = ex[-2] - Z31 - p1*Z11 - p2*Z21;
    ex[-2] = Z31;
    p1 = ell[-3];
    p2 = ell[-3+lskip1];
    p3 = ell[-3+lskip2];
    Z41 = ex[-3] - Z41 - p1*Z11 - p2*Z21 - p3*Z31;
    ex[-3] = Z41;
    /* end of outer loop */
  }
  /* compute rows at end that are not a multiple of block size */
  for (; i < n; i++) {
    /* compute all 1 x 1 block of X, from rows i..i+1-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    ell = L - i;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-4; j >= 0; j -= 4) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-1];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-2];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      Z11 += m11;
      /* load p and q values */
      p1=ell[0];
      q1=ex[-3];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      ex -= 4;
      Z11 += m11;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 4;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      m11 = p1 * q1;
      ell += lskip1;
      ex -= 1;
      Z11 += m11;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
  }
}